

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_invalid_address.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2e0e18::InvalidAddress_throw_invalid_address_Test::TestBody
          (InvalidAddress_throw_invalid_address_Test *this)

{
  InvalidAddress *this_00;
  AssertionResult gtest_ar;
  string expected;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected,"Invalid address [0xABCD]",(allocator<char> *)&gtest_ar);
  this_00 = (InvalidAddress *)__cxa_allocate_exception(0x28);
  n_e_s::core::InvalidAddress::InvalidAddress(this_00,0xabcd);
  __cxa_throw(this_00,&n_e_s::core::InvalidAddress::typeinfo,
              n_e_s::core::InvalidAddress::~InvalidAddress);
}

Assistant:

TEST(InvalidAddress, throw_invalid_address) {
    std::string expected("Invalid address [0xABCD]");

    try {
        throw InvalidAddress(0xABCD);
    } catch (const InvalidAddress &e) {
        EXPECT_STREQ(e.what(), expected.c_str());
    }
}